

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ApplyWindowSettings(ImGuiWindow *window,ImGuiWindowSettings *settings)

{
  undefined8 uVar1;
  ImVec2 IVar2;
  ImVec2 local_48 [2];
  ImVec2 local_38;
  ImVec2 local_30;
  ImVec2 local_28;
  ImGuiViewport *local_20;
  ImGuiViewport *main_viewport;
  ImGuiWindowSettings *settings_local;
  ImGuiWindow *window_local;
  
  main_viewport = (ImGuiViewport *)settings;
  settings_local = (ImGuiWindowSettings *)window;
  local_20 = ImGui::GetMainViewport();
  *(ImVec2 *)&settings_local[1].DockOrder = local_20->Pos;
  if ((main_viewport->Size).x != 0.0) {
    settings_local[1].ClassId = (ImGuiID)(main_viewport->Size).x;
    ImVec2::ImVec2(&local_28,(float)(int)*(short *)&(main_viewport->Pos).y,
                   (float)(int)*(short *)((long)&(main_viewport->Pos).y + 2));
    *(ImVec2 *)&settings_local[1].DockOrder = local_28;
  }
  ImVec2::ImVec2(&local_38,
                 (float)(int)(short)main_viewport->Flags + *(float *)&settings_local[1].DockOrder,
                 (float)(int)*(short *)((long)&main_viewport->Flags + 2) +
                 (float)settings_local[2].ID);
  local_30 = ImFloor(&local_38);
  settings_local[2].Size = (ImVec2ih)local_30.x;
  settings_local[2].ViewportPos = (ImVec2ih)local_30.y;
  if ((0 < *(short *)&(main_viewport->Pos).x) && (0 < *(short *)((long)&(main_viewport->Pos).x + 2))
     ) {
    ImVec2::ImVec2(local_48,(float)(int)*(short *)&(main_viewport->Pos).x,
                   (float)(int)*(short *)((long)&(main_viewport->Pos).x + 2));
    IVar2 = ImFloor(local_48);
    *(ImVec2 *)&settings_local[2].ClassId = IVar2;
    uVar1._0_4_ = settings_local[2].ClassId;
    uVar1._4_2_ = settings_local[2].DockOrder;
    uVar1._6_1_ = settings_local[2].Collapsed;
    uVar1._7_1_ = settings_local[2].WantApply;
    settings_local[2].ViewportId = (undefined4)uVar1;
    settings_local[2].DockId = (int)((ulong)uVar1 >> 0x20);
  }
  *(byte *)&settings_local[6].ViewportPos.y = *(byte *)((long)&(main_viewport->WorkPos).y + 2) & 1;
  settings_local[0x21].Size = (ImVec2ih)(main_viewport->Size).y;
  *(undefined2 *)((long)&settings_local[0x1f].ClassId + 2) =
       *(undefined2 *)&(main_viewport->WorkPos).y;
  return;
}

Assistant:

static void ApplyWindowSettings(ImGuiWindow* window, ImGuiWindowSettings* settings)
{
    const ImGuiViewport* main_viewport = ImGui::GetMainViewport();
    window->ViewportPos = main_viewport->Pos;
    if (settings->ViewportId)
    {
        window->ViewportId = settings->ViewportId;
        window->ViewportPos = ImVec2(settings->ViewportPos.x, settings->ViewportPos.y);
    }
    window->Pos = ImFloor(ImVec2(settings->Pos.x + window->ViewportPos.x, settings->Pos.y + window->ViewportPos.y));
    if (settings->Size.x > 0 && settings->Size.y > 0)
        window->Size = window->SizeFull = ImFloor(ImVec2(settings->Size.x, settings->Size.y));
    window->Collapsed = settings->Collapsed;
    window->DockId = settings->DockId;
    window->DockOrder = settings->DockOrder;
}